

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

void __thiscall
tchecker::system::system_t::add_intvar
          (system_t *this,string *name,intvar_id_t size,integer_t min,integer_t max,
          integer_t initial,attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = has_variable(this,name);
  if (!bVar1) {
    intvars_t::add_intvar(&this->super_intvars_t,name,size,min,max,initial,attributes);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"Variable ",name);
  std::operator+(&local_50,&local_70," is already declared");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void system_t::add_intvar(std::string const & name, tchecker::intvar_id_t size, tchecker::integer_t min,
                          tchecker::integer_t max, tchecker::integer_t initial,
                          tchecker::system::attributes_t const & attributes)
{
  if (has_variable(name))
    throw std::invalid_argument("Variable " + name + " is already declared");
  tchecker::system::intvars_t::add_intvar(name, size, min, max, initial, attributes);
}